

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset_test.c
# Opt level: O3

void process_reset_test(int converter)

{
  float fVar1;
  SRC_STATE *state;
  char *pcVar2;
  undefined8 uVar3;
  char *__format;
  long lVar4;
  float *pfVar5;
  int error;
  SRC_DATA src_data;
  int local_6c;
  SRC_DATA local_68;
  
  src_get_name(converter);
  lVar4 = 0;
  printf("\tprocess_reset_test  (%-28s) ....... ");
  fflush(_stdout);
  memset(data_zero,0,0x2000);
  do {
    *(undefined8 *)((long)data_one + lVar4) = 0x3f8000003f800000;
    *(undefined8 *)((long)data_one + lVar4 + 8) = 0x3f8000003f800000;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x2000);
  state = src_new(converter,1,&local_6c);
  if (state == (SRC_STATE *)0x0) {
    pcVar2 = src_strerror(local_6c);
    __format = "\n\nLine %d : src_new() failed : %s.\n\n";
    uVar3 = 0x45;
  }
  else {
    local_68.data_in = data_one;
    pfVar5 = process_reset_test::output;
    local_68.data_out = process_reset_test::output;
    local_68.input_frames = 0x800;
    local_68.output_frames = 0x800;
    local_68.src_ratio = 0.9;
    local_68.end_of_input = 1;
    local_6c = src_process(state,&local_68);
    if (local_6c == 0) {
      src_reset(state);
      local_68.data_in = data_zero;
      local_68.data_out = process_reset_test::output;
      local_68.input_frames = 0x800;
      local_68.output_frames = 0x800;
      local_68.src_ratio = 0.9;
      local_68.end_of_input = 1;
      local_6c = src_process(state,&local_68);
      if (local_6c == 0) {
        lVar4 = 0;
        while( true ) {
          fVar1 = *pfVar5;
          if ((fVar1 != 0.0) || (NAN(fVar1))) break;
          lVar4 = lVar4 + 1;
          pfVar5 = pfVar5 + 1;
          if (lVar4 == 0x400) {
            src_set_ratio(state,1.0);
            src_delete(state);
            puts("ok");
            return;
          }
        }
        printf("\n\nLine %d : output [%d] should be 0.0, is %f.\n",SUB84((double)fVar1,0),0x69);
        goto LAB_0010145d;
      }
      pcVar2 = src_strerror(local_6c);
      __format = "\n\nLine %d : src_simple () returned error : %s\n\n";
      uVar3 = 0x62;
    }
    else {
      pcVar2 = src_strerror(local_6c);
      __format = "\n\nLine %d : src_simple () returned error : %s\n\n";
      uVar3 = 0x52;
    }
  }
  printf(__format,uVar3,pcVar2);
LAB_0010145d:
  exit(1);
}

Assistant:

static void
process_reset_test (int converter)
{	static float output [BUFFER_LEN] ;

	SRC_STATE *src_state ;
	SRC_DATA src_data ;
	int k, error ;

	printf ("\tprocess_reset_test  (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	for (k = 0 ; k < BUFFER_LEN ; k++)
	{	data_one [k] = 1.0 ;
		data_zero [k] = 0.0 ;
		} ;

	/* Get a converter. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new() failed : %s.\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Process a bunch of 1.0 valued samples. */
	src_data.data_in		= data_one ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Reset the state of the converter.*/
	src_reset (src_state) ;

	/* Now process some zero data. */
	src_data.data_in		= data_zero ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Finally make sure that the output data is zero ie reset was successful. */
	for (k = 0 ; k < BUFFER_LEN / 2 ; k++)
		if (output [k] != 0.0)
		{	printf ("\n\nLine %d : output [%d] should be 0.0, is %f.\n", __LINE__, k, output [k]) ;
			exit (1) ;
			} ;

	/* Make sure that this function has been exported. */
	src_set_ratio (src_state, 1.0) ;

	/* Delete converter. */
	src_state = src_delete (src_state) ;

	puts ("ok") ;
}